

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_kotlin_generator.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::java::KotlinGenerator::Generate
          (KotlinGenerator *this,FileDescriptor *file,string *parameter,GeneratorContext *context,
          string *error)

{
  pointer pbVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  pointer ppVar4;
  bool bVar5;
  int iVar6;
  FileGenerator *this_00;
  undefined4 extraout_var;
  ZeroCopyOutputStream *pZVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *annotation_collector_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *all_file;
  pointer pbVar8;
  pointer __lhs;
  string *psVar9;
  unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
  file_generator;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  all_annotations;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  all_files;
  Options file_options;
  string kotlin_filename;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  options;
  string info_full_path;
  string package_dir;
  string local_1d0;
  GeneratedCodeInfo annotations;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  Printer printer;
  Printer srclist_printer;
  ZeroCopyOutputStream *output;
  undefined4 extraout_var_00;
  
  options.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  options.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  options.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ParseGeneratorParameter(parameter,&options);
  ppVar4 = options.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  file_options.annotation_list_file._M_dataplus._M_p =
       (pointer)&file_options.annotation_list_file.field_2;
  file_options.annotate_code = false;
  file_options.generate_immutable_code = false;
  file_options.generate_mutable_code = false;
  file_options.generate_shared_code = false;
  file_options.enforce_lite = false;
  file_options.annotation_list_file._M_string_length = 0;
  file_options.annotation_list_file.field_2._M_local_buf[0] = '\0';
  file_options.output_list_file._M_dataplus._M_p = (pointer)&file_options.output_list_file.field_2;
  file_options.output_list_file._M_string_length = 0;
  file_options.output_list_file.field_2._M_local_buf[0] = '\0';
  __lhs = options.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  do {
    uVar2 = file_options._0_4_;
    if (__lhs == ppVar4) {
      if ((file_options.generate_immutable_code == false) &&
         (file_options.generate_shared_code == false)) {
        file_options.generate_immutable_code = true;
        uVar3 = file_options._0_4_;
        file_options.enforce_lite = SUB41(uVar2,3);
        file_options._0_2_ = SUB42(uVar3,0);
        file_options.generate_shared_code = true;
      }
      all_files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      all_files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      all_files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      all_annotations.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      all_annotations.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      all_annotations.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      file_generator._M_t.
      super___uniq_ptr_impl<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
      ._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::java::FileGenerator_*,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
      .super__Head_base<0UL,_google::protobuf::compiler::java::FileGenerator_*,_false>._M_head_impl
           = (__uniq_ptr_data<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>,_true,_true>
              )(__uniq_ptr_impl<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
                )0x0;
      this_00 = (FileGenerator *)operator_new(0xe0);
      FileGenerator::FileGenerator(this_00,file,&file_options,true);
      std::
      __uniq_ptr_impl<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
      ::reset((__uniq_ptr_impl<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
               *)&file_generator,this_00);
      bVar5 = FileGenerator::Validate
                        ((FileGenerator *)
                         file_generator._M_t.
                         super___uniq_ptr_impl<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_google::protobuf::compiler::java::FileGenerator_*,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
                         .
                         super__Head_base<0UL,_google::protobuf::compiler::java::FileGenerator_*,_false>
                         ._M_head_impl,error);
      if (bVar5) {
        std::__cxx11::string::string
                  ((string *)&local_1d0,
                   (string *)
                   ((long)file_generator._M_t.
                          super___uniq_ptr_impl<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_google::protobuf::compiler::java::FileGenerator_*,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
                          .
                          super__Head_base<0UL,_google::protobuf::compiler::java::FileGenerator_*,_false>
                          ._M_head_impl + 8));
        JavaPackageToDir(&package_dir,&local_1d0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::string((string *)&kotlin_filename,(string *)&package_dir);
        FileGenerator::GetKotlinClassname_abi_cxx11_
                  ((string *)&printer,
                   (FileGenerator *)
                   file_generator._M_t.
                   super___uniq_ptr_impl<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::compiler::java::FileGenerator_*,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
                   .super__Head_base<0UL,_google::protobuf::compiler::java::FileGenerator_*,_false>.
                   _M_head_impl);
        std::__cxx11::string::append((string *)&kotlin_filename);
        std::__cxx11::string::~string((string *)&printer);
        std::__cxx11::string::append((char *)&kotlin_filename);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&all_files,&kotlin_filename);
        std::operator+(&info_full_path,&kotlin_filename,".pb.meta");
        if (file_options.annotate_code == true) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&all_annotations,&info_full_path);
        }
        iVar6 = (*context->_vptr_GeneratorContext[2])(context,&kotlin_filename);
        output = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar6);
        GeneratedCodeInfo::GeneratedCodeInfo(&annotations);
        annotation_collector.super_AnnotationCollector._vptr_AnnotationCollector =
             (_func_int **)&PTR_AddAnnotation_004d7460;
        annotation_collector_00 =
             (AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)0x0;
        if (file_options.annotate_code != false) {
          annotation_collector_00 = &annotation_collector;
        }
        annotation_collector.annotation_proto_ = &annotations;
        io::Printer::Printer
                  (&printer,output,'$',&annotation_collector_00->super_AnnotationCollector);
        FileGenerator::GenerateKotlinSiblings
                  ((FileGenerator *)
                   file_generator._M_t.
                   super___uniq_ptr_impl<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::compiler::java::FileGenerator_*,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
                   .super__Head_base<0UL,_google::protobuf::compiler::java::FileGenerator_*,_false>.
                   _M_head_impl,&package_dir,context,&all_files,&all_annotations);
        if (file_options.annotate_code == true) {
          iVar6 = (*context->_vptr_GeneratorContext[2])(context,&info_full_path);
          pZVar7 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar6);
          MessageLite::SerializeToZeroCopyStream((MessageLite *)&annotations,pZVar7);
          if (pZVar7 != (ZeroCopyOutputStream *)0x0) {
            (*pZVar7->_vptr_ZeroCopyOutputStream[1])(pZVar7);
          }
        }
        if (file_options.output_list_file._M_string_length != 0) {
          iVar6 = (*context->_vptr_GeneratorContext[2])(context,&file_options.output_list_file);
          pZVar7 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_01,iVar6);
          io::Printer::Printer(&srclist_printer,pZVar7,'$');
          pbVar1 = all_files.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pbVar8 = all_files.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar1;
              pbVar8 = pbVar8 + 1) {
            io::Printer::Print<char[9],std::__cxx11::string>
                      (&srclist_printer,"$filename$\n",(char (*) [9])"filename",pbVar8);
          }
          io::Printer::~Printer(&srclist_printer);
          if (pZVar7 != (ZeroCopyOutputStream *)0x0) {
            (*pZVar7->_vptr_ZeroCopyOutputStream[1])(pZVar7);
          }
        }
        if (file_options.annotation_list_file._M_string_length != 0) {
          iVar6 = (*context->_vptr_GeneratorContext[2])(context,&file_options.annotation_list_file);
          pZVar7 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_02,iVar6);
          io::Printer::Printer(&srclist_printer,pZVar7,'$');
          pbVar1 = all_annotations.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pbVar8 = all_annotations.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar1;
              pbVar8 = pbVar8 + 1) {
            io::Printer::Print<char[9],std::__cxx11::string>
                      (&srclist_printer,"$filename$\n",(char (*) [9])"filename",pbVar8);
          }
          io::Printer::~Printer(&srclist_printer);
          if (pZVar7 != (ZeroCopyOutputStream *)0x0) {
            (*pZVar7->_vptr_ZeroCopyOutputStream[1])(pZVar7);
          }
        }
        io::Printer::~Printer(&printer);
        GeneratedCodeInfo::~GeneratedCodeInfo(&annotations);
        if (output != (ZeroCopyOutputStream *)0x0) {
          (*output->_vptr_ZeroCopyOutputStream[1])();
        }
        std::__cxx11::string::~string((string *)&info_full_path);
        std::__cxx11::string::~string((string *)&kotlin_filename);
        std::__cxx11::string::~string((string *)&package_dir);
      }
      std::
      unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
      ::~unique_ptr(&file_generator);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&all_annotations);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&all_files);
LAB_0029743d:
      Options::~Options(&file_options);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&options);
      return bVar5;
    }
    bVar5 = std::operator==(&__lhs->first,"output_list_file");
    psVar9 = (string *)&file_options.output_list_file;
    if (bVar5) {
LAB_00296fb6:
      std::__cxx11::string::_M_assign(psVar9);
    }
    else {
      bVar5 = std::operator==(&__lhs->first,"immutable");
      if (bVar5) {
        file_options.generate_immutable_code = true;
      }
      else {
        bVar5 = std::operator==(&__lhs->first,"mutable");
        if (bVar5) {
          std::__cxx11::string::assign((char *)error);
LAB_0029743b:
          bVar5 = false;
          goto LAB_0029743d;
        }
        bVar5 = std::operator==(&__lhs->first,"shared");
        if (bVar5) {
          file_options.generate_shared_code = true;
        }
        else {
          bVar5 = std::operator==(&__lhs->first,"lite");
          if (bVar5) {
            file_options.enforce_lite = true;
          }
          else {
            bVar5 = std::operator==(&__lhs->first,"annotate_code");
            if (!bVar5) {
              bVar5 = std::operator==(&__lhs->first,"annotation_list_file");
              psVar9 = (string *)&file_options.annotation_list_file;
              if (bVar5) goto LAB_00296fb6;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &printer,"Unknown generator option: ",&__lhs->first);
              std::__cxx11::string::operator=((string *)error,(string *)&printer);
              std::__cxx11::string::~string((string *)&printer);
              goto LAB_0029743b;
            }
            file_options.annotate_code = true;
          }
        }
      }
    }
    __lhs = __lhs + 1;
  } while( true );
}

Assistant:

bool KotlinGenerator::Generate(const FileDescriptor* file,
                               const std::string& parameter,
                               GeneratorContext* context,
                               std::string* error) const {
  // -----------------------------------------------------------------
  // parse generator options

  std::vector<std::pair<std::string, std::string> > options;
  ParseGeneratorParameter(parameter, &options);
  Options file_options;

  for (auto& option : options) {
    if (option.first == "output_list_file") {
      file_options.output_list_file = option.second;
    } else if (option.first == "immutable") {
      file_options.generate_immutable_code = true;
    } else if (option.first == "mutable") {
      *error = "Mutable not supported by Kotlin generator";
      return false;
    } else if (option.first == "shared") {
      file_options.generate_shared_code = true;
    } else if (option.first == "lite") {
      file_options.enforce_lite = true;
    } else if (option.first == "annotate_code") {
      file_options.annotate_code = true;
    } else if (option.first == "annotation_list_file") {
      file_options.annotation_list_file = option.second;
    } else {
      *error = "Unknown generator option: " + option.first;
      return false;
    }
  }

  // By default we generate immutable code and shared code for immutable API.
  if (!file_options.generate_immutable_code &&
      !file_options.generate_shared_code) {
    file_options.generate_immutable_code = true;
    file_options.generate_shared_code = true;
  }

  std::vector<std::string> all_files;
  std::vector<std::string> all_annotations;

  std::unique_ptr<FileGenerator> file_generator;
  if (file_options.generate_immutable_code) {
    file_generator.reset(
        new FileGenerator(file, file_options, /* immutable_api = */ true));
  }

  if (!file_generator->Validate(error)) {
    return false;
  }

  auto open_file = [context](const std::string& filename) {
    return std::unique_ptr<io::ZeroCopyOutputStream>(context->Open(filename));
  };
  std::string package_dir = JavaPackageToDir(file_generator->java_package());
  std::string kotlin_filename = package_dir;
  kotlin_filename += file_generator->GetKotlinClassname();
  kotlin_filename += ".kt";
  all_files.push_back(kotlin_filename);
  std::string info_full_path = kotlin_filename + ".pb.meta";
  if (file_options.annotate_code) {
    all_annotations.push_back(info_full_path);
  }

  // Generate main kotlin file.
  auto output = open_file(kotlin_filename);
  GeneratedCodeInfo annotations;
  io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
      &annotations);
  io::Printer printer(
      output.get(), '$',
      file_options.annotate_code ? &annotation_collector : nullptr);

  file_generator->GenerateKotlinSiblings(package_dir, context, &all_files,
                                         &all_annotations);

  if (file_options.annotate_code) {
    auto info_output = open_file(info_full_path);
    annotations.SerializeToZeroCopyStream(info_output.get());
  }

  // Generate output list if requested.
  if (!file_options.output_list_file.empty()) {
    // Generate output list.  This is just a simple text file placed in a
    // deterministic location which lists the .kt files being generated.
    auto srclist_raw_output = open_file(file_options.output_list_file);
    io::Printer srclist_printer(srclist_raw_output.get(), '$');
    for (auto& all_file : all_files) {
      srclist_printer.Print("$filename$\n", "filename", all_file);
    }
  }

  if (!file_options.annotation_list_file.empty()) {
    // Generate output list.  This is just a simple text file placed in a
    // deterministic location which lists the .kt files being generated.
    auto annotation_list_raw_output =
        open_file(file_options.annotation_list_file);
    io::Printer annotation_list_printer(annotation_list_raw_output.get(), '$');
    for (auto& all_annotation : all_annotations) {
      annotation_list_printer.Print("$filename$\n", "filename", all_annotation);
    }
  }

  return true;
}